

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool __thiscall pugi::xml_node::remove_attributes(xml_node *this)

{
  xml_attribute_struct *pxVar1;
  bool bVar2;
  xml_allocator *this_00;
  xml_attribute_struct *next;
  xml_attribute_struct *attr;
  xml_allocator *alloc;
  xml_node *this_local;
  
  if (this->_root == (xml_node_struct *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    this_00 = impl::anon_unknown_0::get_allocator<pugi::xml_node_struct>(this->_root);
    bVar2 = impl::anon_unknown_0::xml_allocator::reserve(this_00);
    if (bVar2) {
      next = this->_root->first_attribute;
      while (next != (xml_attribute_struct *)0x0) {
        pxVar1 = next->next_attribute;
        impl::anon_unknown_0::destroy_attribute(next,this_00);
        next = pxVar1;
      }
      this->_root->first_attribute = (xml_attribute_struct *)0x0;
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

PUGI__FN bool xml_node::remove_attributes()
	{
		if (!_root) return false;
		
		impl::xml_allocator& alloc = impl::get_allocator(_root);
		if (!alloc.reserve()) return false;

		for (xml_attribute_struct* attr = _root->first_attribute; attr; )
		{
			xml_attribute_struct* next = attr->next_attribute;

			impl::destroy_attribute(attr, alloc);

			attr = next;
		}

		_root->first_attribute = 0;

		return true;
	}